

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

float nk_widget_height(nk_context *ctx)

{
  nk_rect bounds;
  nk_rect nStack_18;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x4992,"float nk_widget_height(struct nk_context *)");
  }
  if (ctx->current != (nk_window *)0x0) {
    nk_layout_peek(&nStack_18,ctx);
    return nStack_18.h;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x4993,"float nk_widget_height(struct nk_context *)");
}

Assistant:

NK_API float
nk_widget_height(struct nk_context *ctx)
{
    struct nk_rect bounds;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current)
        return 0;

    nk_layout_peek(&bounds, ctx);
    return bounds.h;
}